

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::decode_url(string *s,bool convert_plus_to_space)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  string *s_00;
  string *psVar4;
  byte in_DL;
  ulong in_RSI;
  string *in_RDI;
  int val_1;
  size_t len;
  char buff [4];
  int val;
  size_t i;
  string *result;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  size_t in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  char local_38 [20];
  int local_24;
  ulong local_20;
  undefined1 local_12;
  byte local_11;
  ulong local_10;
  
  local_11 = in_DL & 1;
  local_12 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = 0;
  do {
    uVar1 = local_20;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar1) {
      return in_RDI;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
    if (*pcVar3 == '%') {
      s_00 = (string *)(local_20 + 1);
      psVar4 = (string *)std::__cxx11::string::size();
      if (psVar4 <= s_00) goto LAB_001a54e0;
      pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
      if (*pcVar3 == 'u') {
        local_24 = 0;
        in_stack_ffffffffffffff97 =
             from_hex_to_i(s_00,CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88,
                           (int *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
        if ((bool)in_stack_ffffffffffffff97) {
          in_stack_ffffffffffffff88 = to_utf8(local_24,local_38);
          if (in_stack_ffffffffffffff88 != 0) {
            std::__cxx11::string::append((char *)in_RDI,(ulong)local_38);
          }
          local_20 = local_20 + 5;
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
          std::__cxx11::string::operator+=((string *)in_RDI,*pcVar3);
        }
      }
      else {
        in_stack_ffffffffffffff87 =
             from_hex_to_i(s_00,CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88,
                           (int *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
        if ((bool)in_stack_ffffffffffffff87) {
          std::__cxx11::string::operator+=((string *)in_RDI,'\0');
          local_20 = local_20 + 2;
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
          std::__cxx11::string::operator+=((string *)in_RDI,*pcVar3);
        }
      }
    }
    else {
LAB_001a54e0:
      if (((local_11 & 1) == 0) ||
         (pcVar3 = (char *)std::__cxx11::string::operator[](local_10), *pcVar3 != '+')) {
        pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
        std::__cxx11::string::operator+=((string *)in_RDI,*pcVar3);
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI,' ');
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

inline std::string decode_url(const std::string &s,
                              bool convert_plus_to_space) {
  std::string result;

  for (size_t i = 0; i < s.size(); i++) {
    if (s[i] == '%' && i + 1 < s.size()) {
      if (s[i + 1] == 'u') {
        auto val = 0;
        if (from_hex_to_i(s, i + 2, 4, val)) {
          // 4 digits Unicode codes
          char buff[4];
          size_t len = to_utf8(val, buff);
          if (len > 0) { result.append(buff, len); }
          i += 5; // 'u0000'
        } else {
          result += s[i];
        }
      } else {
        auto val = 0;
        if (from_hex_to_i(s, i + 1, 2, val)) {
          // 2 digits hex codes
          result += static_cast<char>(val);
          i += 2; // '00'
        } else {
          result += s[i];
        }
      }
    } else if (convert_plus_to_space && s[i] == '+') {
      result += ' ';
    } else {
      result += s[i];
    }
  }

  return result;
}